

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::GetComponent<tcu::Vector<float,_4>_>::doApply
          (IRet *__return_storage_ptr__,GetComponent<tcu::Vector<float,_4>_> *this,
          EvalContext *param_1,IArgs *iargs)

{
  bool bVar1;
  Interval *pIVar2;
  IVal local_58;
  Interval local_40;
  int local_24;
  IArgs *pIStack_20;
  int compNdx;
  IArgs *iargs_local;
  EvalContext *param_1_local;
  GetComponent<tcu::Vector<float,_4>_> *this_local;
  
  pIStack_20 = iargs;
  iargs_local = (IArgs *)param_1;
  param_1_local = (EvalContext *)this;
  tcu::Interval::Interval(__return_storage_ptr__);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    pIVar2 = pIStack_20->b;
    tcu::Interval::Interval(&local_40,(double)local_24);
    bVar1 = tcu::Interval::contains(pIVar2,&local_40);
    if (bVar1) {
      pIVar2 = tcu::Vector<tcu::Interval,_4>::operator[](pIStack_20->a,local_24);
      unionIVal<float>(&local_58,__return_storage_ptr__,pIVar2);
      __return_storage_ptr__->m_hasNaN = local_58.m_hasNaN;
      *(undefined7 *)&__return_storage_ptr__->field_0x1 = local_58._1_7_;
      __return_storage_ptr__->m_lo = local_58.m_lo;
      __return_storage_ptr__->m_hi = local_58.m_hi;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&,
							 const typename GetComponent::IArgs& iargs) const
	{
		IRet ret;

		for (int compNdx = 0; compNdx < T::SIZE; ++compNdx)
		{
			if (iargs.b.contains(compNdx))
				ret = unionIVal<typename T::Element>(ret, iargs.a[compNdx]);
		}

		return ret;
	}